

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O3

void rb_insert_fixup(lgx_rb_t *rbt,lgx_rb_node_t *node)

{
  uintptr_t *puVar1;
  lgx_rb_node_s *plVar2;
  lgx_rb_node_s *plVar3;
  lgx_rb_node_s *plVar4;
  lgx_rb_node_t *plVar5;
  lgx_rb_node_t *plVar6;
  lgx_rb_node_t *plVar7;
  lgx_rb_node_t *uncle;
  ulong uVar8;
  lgx_rb_node_s *plVar9;
  ulong *puVar10;
  long *plVar11;
  
  do {
    while( true ) {
      plVar5 = (lgx_rb_node_t *)(node->parent_color & 0xfffffffffffffffc);
      if ((plVar5 == (lgx_rb_node_t *)0x0) || (uVar8 = plVar5->parent_color, (uVar8 & 1) != 0)) {
        puVar1 = &rbt->root->parent_color;
        *puVar1 = *puVar1 | 1;
        return;
      }
      plVar4 = (lgx_rb_node_s *)(uVar8 & 0xfffffffffffffffc);
      plVar6 = plVar4->left;
      if (plVar6 == plVar5) break;
      if ((plVar6 == (lgx_rb_node_t *)0x0) || ((plVar6->parent_color & 1) != 0)) {
        plVar2 = plVar5->left;
        plVar6 = plVar5;
        if (plVar2 == node) {
          plVar3 = plVar2->right;
          plVar5->left = plVar3;
          plVar9 = plVar4;
          if (plVar3 != (lgx_rb_node_s *)0x0) {
            plVar3->parent_color = (ulong)((uint)plVar3->parent_color & 3) | (ulong)plVar5;
            plVar9 = (lgx_rb_node_s *)(plVar5->parent_color & 0xfffffffffffffffc);
          }
          plVar2->parent_color = (ulong)((uint)plVar2->parent_color & 3) | (ulong)plVar9;
          if (rbt->root == plVar5) {
            rbt->root = plVar2;
            uVar8 = plVar5->parent_color;
          }
          else {
            uVar8 = plVar5->parent_color;
            plVar11 = (long *)(uVar8 & 0xfffffffffffffffc);
            if ((lgx_rb_node_t *)plVar11[1] == plVar5) {
              plVar11[1] = (long)plVar2;
            }
            else {
              *plVar11 = (long)plVar2;
            }
          }
          plVar2->right = plVar5;
          plVar5->parent_color = (ulong)((uint)uVar8 & 3) | (ulong)node;
          uVar8 = node->parent_color;
          plVar6 = node;
          node = plVar5;
        }
        plVar6->parent_color = uVar8 | 1;
        plVar2 = plVar4->right;
        uVar8 = plVar4->parent_color & 0xfffffffffffffffe;
        plVar4->parent_color = uVar8;
        plVar3 = plVar2->left;
        plVar4->right = plVar3;
        if (plVar3 != (lgx_rb_node_s *)0x0) {
          plVar3->parent_color = (ulong)((uint)plVar3->parent_color & 3) | (ulong)plVar4;
          uVar8 = plVar4->parent_color;
        }
        plVar2->parent_color = (ulong)((uint)plVar2->parent_color & 3) | uVar8 & 0xfffffffffffffffc;
        if (rbt->root == plVar4) {
          rbt->root = plVar2;
          uVar8 = plVar4->parent_color;
        }
        else {
          uVar8 = plVar4->parent_color;
          puVar10 = (ulong *)(uVar8 & 0xfffffffffffffffc);
          if ((lgx_rb_node_s *)*puVar10 == plVar4) {
            *puVar10 = (ulong)plVar2;
          }
          else {
            puVar10[1] = (ulong)plVar2;
          }
        }
        plVar2->left = plVar4;
        plVar4->parent_color = (ulong)((uint)uVar8 & 3) | (ulong)plVar2;
      }
      else {
        plVar6->parent_color = plVar6->parent_color | 1;
LAB_001116b9:
        *(byte *)&plVar5->parent_color = (byte)plVar5->parent_color | 1;
        *(byte *)&plVar4->parent_color = (byte)plVar4->parent_color & 0xfe;
        node = plVar4;
      }
    }
    plVar2 = plVar4->right;
    if ((plVar2 != (lgx_rb_node_s *)0x0) && ((plVar2->parent_color & 1) == 0)) {
      plVar2->parent_color = plVar2->parent_color | 1;
      goto LAB_001116b9;
    }
    plVar2 = plVar5->right;
    plVar7 = plVar5;
    if (plVar2 == node) {
      plVar3 = plVar2->left;
      plVar5->right = plVar3;
      plVar9 = plVar4;
      if (plVar3 != (lgx_rb_node_s *)0x0) {
        plVar3->parent_color = (ulong)((uint)plVar3->parent_color & 3) | (ulong)plVar5;
        plVar9 = (lgx_rb_node_s *)(plVar5->parent_color & 0xfffffffffffffffc);
      }
      plVar2->parent_color = (ulong)((uint)plVar2->parent_color & 3) | (ulong)plVar9;
      if (rbt->root == plVar5) {
        rbt->root = plVar2;
        uVar8 = plVar5->parent_color;
      }
      else {
        uVar8 = plVar5->parent_color;
        puVar10 = (ulong *)(uVar8 & 0xfffffffffffffffc);
        if ((lgx_rb_node_t *)*puVar10 == plVar5) {
          *puVar10 = (ulong)plVar2;
        }
        else {
          puVar10[1] = (ulong)plVar2;
        }
      }
      plVar2->left = plVar5;
      plVar5->parent_color = (ulong)((uint)uVar8 & 3) | (ulong)node;
      uVar8 = node->parent_color;
      plVar6 = plVar4->left;
      plVar7 = node;
      node = plVar5;
    }
    plVar7->parent_color = uVar8 | 1;
    uVar8 = plVar4->parent_color & 0xfffffffffffffffe;
    plVar4->parent_color = uVar8;
    plVar2 = plVar6->right;
    plVar4->left = plVar2;
    if (plVar2 != (lgx_rb_node_s *)0x0) {
      plVar2->parent_color = (ulong)((uint)plVar2->parent_color & 3) | (ulong)plVar4;
      uVar8 = plVar4->parent_color;
    }
    plVar6->parent_color = (ulong)((uint)plVar6->parent_color & 3) | uVar8 & 0xfffffffffffffffc;
    if (rbt->root == plVar4) {
      rbt->root = plVar6;
      uVar8 = plVar4->parent_color;
    }
    else {
      uVar8 = plVar4->parent_color;
      puVar10 = (ulong *)(uVar8 & 0xfffffffffffffffc);
      if ((lgx_rb_node_s *)puVar10[1] == plVar4) {
        puVar10[1] = (ulong)plVar6;
      }
      else {
        *puVar10 = (ulong)plVar6;
      }
    }
    plVar6->right = plVar4;
    plVar4->parent_color = (ulong)((uint)uVar8 & 3) | (ulong)plVar6;
  } while( true );
}

Assistant:

void rb_insert_fixup(lgx_rb_t *rbt, lgx_rb_node_t *node) {  
    lgx_rb_node_t *parent, *gparent;  
  
    while ((parent = rb_parent(node)) && rb_is_red(parent)) {
        gparent = rb_parent(parent); 
  
        if (parent == gparent->left) {  
            {
                register lgx_rb_node_t *uncle = gparent->right; 
                if (uncle && rb_is_red(uncle)) {  
                    rb_set_black(uncle);
                    rb_set_black(parent);
                    rb_set_red(gparent);
                    node = gparent;
                    continue;
                }  
            }
  
            if (parent->right == node) {  
                register lgx_rb_node_t *tmp;  
                rb_rotate_left(rbt, parent);
                tmp = parent;
                parent = node;  
                node = tmp;  
            }  
  
            rb_set_black(parent);
            rb_set_red(gparent);
            rb_rotate_right(rbt, gparent);
        } else {
            {
                register lgx_rb_node_t *uncle = gparent->left;  
                if (uncle && rb_is_red(uncle)) {  
                    rb_set_black(uncle);  
                    rb_set_black(parent);  
                    rb_set_red(gparent);  
                    node = gparent;  
                    continue;  
                }
            }
  
            if (parent->left == node) {  
                register lgx_rb_node_t *tmp;  
                rb_rotate_right(rbt, parent);  
                tmp = parent;  
                parent = node;  
                node = tmp;  
            }  
  
            rb_set_black(parent);  
            rb_set_red(gparent);  
            rb_rotate_left(rbt, gparent);  
        }
    }
  
    rb_set_black(rbt->root);  
}